

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# aggregate_executor.hpp
# Opt level: O1

void duckdb::AggregateExecutor::
     UnaryScatterLoop<duckdb::AvgState<duckdb::hugeint_t>,duckdb::hugeint_t,duckdb::HugeintAverageOperation>
               (hugeint_t *idata,AggregateInputData *aggr_input_data,
               AvgState<duckdb::hugeint_t> **states,SelectionVector *isel,SelectionVector *ssel,
               ValidityMask *mask,idx_t count)

{
  unsigned_long *puVar1;
  AvgState<duckdb::hugeint_t> *pAVar2;
  hugeint_t lhs;
  hugeint_t rhs;
  hugeint_t rhs_00;
  ulong uVar3;
  ulong uVar4;
  int64_t unaff_RBX;
  ulong uVar5;
  uint64_t unaff_R12;
  int64_t unaff_R13;
  hugeint_t hVar6;
  
  if ((mask->super_TemplatedValidityMask<unsigned_long>).validity_mask == (unsigned_long *)0x0) {
    if (count != 0) {
      uVar5 = 0;
      do {
        uVar3 = uVar5;
        if (ssel->sel_vector != (sel_t *)0x0) {
          uVar3 = (ulong)ssel->sel_vector[uVar5];
        }
        pAVar2 = states[uVar3];
        pAVar2->count = pAVar2->count + 1;
        hVar6.upper = unaff_RBX;
        hVar6.lower = (uint64_t)states;
        rhs_00.upper = unaff_R13;
        rhs_00.lower = unaff_R12;
        hVar6 = Hugeint::Add<true>(hVar6,rhs_00);
        pAVar2->value = hVar6;
        uVar5 = uVar5 + 1;
      } while (count != uVar5);
    }
  }
  else if (count != 0) {
    uVar5 = 0;
    do {
      uVar3 = uVar5;
      if (isel->sel_vector != (sel_t *)0x0) {
        uVar3 = (ulong)isel->sel_vector[uVar5];
      }
      uVar4 = uVar5;
      if (ssel->sel_vector != (sel_t *)0x0) {
        uVar4 = (ulong)ssel->sel_vector[uVar5];
      }
      puVar1 = (mask->super_TemplatedValidityMask<unsigned_long>).validity_mask;
      if ((puVar1 == (unsigned_long *)0x0) || ((puVar1[uVar3 >> 6] >> (uVar3 & 0x3f) & 1) != 0)) {
        pAVar2 = states[uVar4];
        pAVar2->count = pAVar2->count + 1;
        lhs.upper = unaff_RBX;
        lhs.lower = (uint64_t)states;
        rhs.upper = unaff_R13;
        rhs.lower = unaff_R12;
        hVar6 = Hugeint::Add<true>(lhs,rhs);
        pAVar2->value = hVar6;
      }
      uVar5 = uVar5 + 1;
    } while (count != uVar5);
  }
  return;
}

Assistant:

static inline void UnaryScatterLoop(const INPUT_TYPE *__restrict idata, AggregateInputData &aggr_input_data,
	                                    STATE_TYPE **__restrict states, const SelectionVector &isel,
	                                    const SelectionVector &ssel, ValidityMask &mask, idx_t count) {
		if (OP::IgnoreNull() && !mask.AllValid()) {
			// potential NULL values and NULL values are ignored
			AggregateUnaryInput input(aggr_input_data, mask);
			for (idx_t i = 0; i < count; i++) {
				input.input_idx = isel.get_index(i);
				auto sidx = ssel.get_index(i);
				if (mask.RowIsValid(input.input_idx)) {
					OP::template Operation<INPUT_TYPE, STATE_TYPE, OP>(*states[sidx], idata[input.input_idx], input);
				}
			}
		} else {
			// quick path: no NULL values or NULL values are not ignored
			AggregateUnaryInput input(aggr_input_data, mask);
			for (idx_t i = 0; i < count; i++) {
				input.input_idx = isel.get_index(i);
				auto sidx = ssel.get_index(i);
				OP::template Operation<INPUT_TYPE, STATE_TYPE, OP>(*states[sidx], idata[input.input_idx], input);
			}
		}
	}